

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> * __thiscall
args::Matcher::GetFlagStrings
          (vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *__return_storage_ptr__,
          Matcher *this)

{
  undefined8 in_RAX;
  _Hash_node_base *p_Var1;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *__range2;
  __node_base *p_Var2;
  char flag;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_28 = in_RAX;
  std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::reserve
            (__return_storage_ptr__,
             (this->longFlags)._M_h._M_element_count + (this->shortFlags)._M_h._M_element_count);
  p_Var1 = (this->shortFlags)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      uStack_28 = CONCAT17(*(undefined1 *)&p_Var1[1]._M_nxt,(undefined7)uStack_28);
      std::vector<args::EitherFlag,std::allocator<args::EitherFlag>>::emplace_back<char_const&>
                ((vector<args::EitherFlag,std::allocator<args::EitherFlag>> *)__return_storage_ptr__
                 ,(char *)((long)&uStack_28 + 7));
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  p_Var2 = &(this->longFlags)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    std::vector<args::EitherFlag,std::allocator<args::EitherFlag>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<args::EitherFlag,std::allocator<args::EitherFlag>> *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<EitherFlag> GetFlagStrings() const
            {
                std::vector<EitherFlag> flagStrings;
                flagStrings.reserve(shortFlags.size() + longFlags.size());
                for (const char flag: shortFlags)
                {
                    flagStrings.emplace_back(flag);
                }
                for (const std::string &flag: longFlags)
                {
                    flagStrings.emplace_back(flag);
                }
                return flagStrings;
            }